

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O2

PackageInfo * chatra::emb::io::packageInfo(void)

{
  _Alloc_hider _Var1;
  long lVar2;
  PackageInfo *in_RDI;
  initializer_list<chatra::Script> __l;
  initializer_list<chatra::NativeCallHandlerInfo> __l_00;
  NativeCallHandlerInfo local_9e8 [4];
  NativeCallHandlerInfo local_848;
  NativeCallHandlerInfo local_7e0;
  NativeCallHandlerInfo local_778;
  NativeCallHandlerInfo local_710;
  NativeCallHandlerInfo local_6a8;
  NativeCallHandlerInfo local_640;
  NativeCallHandlerInfo local_5d8;
  NativeCallHandlerInfo local_570;
  NativeCallHandlerInfo local_508;
  NativeCallHandlerInfo local_4a0;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  allocator local_40;
  allocator local_3f;
  allocator local_3e;
  allocator local_3d;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35;
  allocator local_34;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator_type local_2b;
  allocator local_2a;
  allocator_type local_29;
  
  std::__cxx11::string::string
            ((string *)&local_438,"io",
             (allocator *)
             &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string
            ((string *)&local_418,
             "\n/*\n * Programming language \'Chatra\' reference implementation\n *\n * Copyright(C) 2019-2020 Chatra Project Team\n *\n * Licensed under the Apache License, Version 2.0 (the \"License\");\n * you may not use this file except in compliance with the License.\n * You may obtain a copy of the License at\n *\n *   http://www.apache.org/licenses/LICENSE-2.0\n *\n * Unless required by applicable law or agreed to in writing, software\n * distributed under the License is distributed on an \"AS IS\" BASIS,\n * WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n * See the License for the specific language governing permissions and\n * limitations under the License.\n *\n * author: Satoshi Hosokawa (chatra.hosokawa@gmail.com)\n */\n\nimport containers\n\nclass Stream\n\tdef close()\n\n\nclass InputStream extends Stream\n\tdef init()\n\t\tsuper()\n\n\tdef available()\n\t\treturn 0\n\n\tdef read(buffer: ByteArray, offset: 0, length: -1)\n\t\tthrow UnsupportedOperationException()\n\n\tdef skip(length: Int)\n\t\treturn read(ByteArray().resize(length))\n\n\nclass OutputStream extends Stream\n\tdef init()\n\t\tsuper()\n\n\tdef flush()\n\n\tdef write(buffer: ByteArray, offset: 0, length: -1)\n\t\tthrow UnsupportedOperationException()\n\n\nclass RandomAccessStream extends Stream\n\tdef init()\n\t\tsuper()\n\n\tdef seek(offset: Int; begin: false, end: false, current: false)  // default is current\n\t\tthrow UnsupportedOperationException()\n\n\tdef position()\n\t\tthrow UnsupportedOperationException()\n\n\nclass FileInputStream extends InputStream, RandomAccessStream\n\tdef _init_instance(fileName, kwargs) as native\n\n\tdef init(fileName: String; kwargs...)\n\t\tif fileName == null\n\t\t\tthrow IllegalArgumentException()\n\t\tsuper.InputStream()\n\t\tsuper.RandomAccessStream()\n\t\t_init_instance(fileName, kwargs)\n\n\tdef close() as native\n\n\tdef available() as native\n\n\tdef _native_read(buffer, offset, length) as native\n\n\tdef read(buffer: ByteArray, offset: 0, length: -1)\n\t\tif buffer == null\n\t\t\tthrow IllegalArgumentException()\n\t\treturn _native_read(buffer, offset, length)\n\n\tdef skip(length: Int)\n\t    if length < 0\n\t        thr..." /* TRUNCATED STRING LITERAL */
             ,&local_2a);
  Script::Script((Script *)local_9e8,&local_438,&local_418);
  __l._M_len = 1;
  __l._M_array = (iterator)local_9e8;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_78,__l,&local_29);
  Script::~Script((Script *)local_9e8);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::string((string *)&local_3f8,"FileInputStream",&local_2a);
  std::__cxx11::string::string((string *)&local_3d8,"_init_instance",(allocator *)&local_29);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (local_9e8,fileInputStream_initInstance,&local_3f8,&local_3d8);
  std::__cxx11::string::string
            ((string *)&local_3b8,"FileInputStream",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::__cxx11::string::string
            ((string *)&local_398,"close",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (local_9e8 + 1,fileInputStream_close,&local_3b8,&local_398);
  std::__cxx11::string::string
            ((string *)&local_378,"FileInputStream",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::__cxx11::string::string
            ((string *)&local_358,"available",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (local_9e8 + 2,fileInputStream_available,&local_378,&local_358);
  std::__cxx11::string::string
            ((string *)&local_338,"FileInputStream",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::string((string *)&local_318,"_native_read",&local_40);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (local_9e8 + 3,fileInputStream_read,&local_338,&local_318);
  std::__cxx11::string::string((string *)&local_2f8,"FileInputStream",&local_3f);
  std::__cxx11::string::string((string *)&local_2d8,"_native_seek",&local_3e);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_848,fileInputStream_seek,&local_2f8,&local_2d8);
  std::__cxx11::string::string((string *)&local_2b8,"FileInputStream",&local_3d);
  std::__cxx11::string::string((string *)&local_298,"position",&local_3c);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_7e0,fileInputStream_position,&local_2b8,&local_298);
  std::__cxx11::string::string((string *)&local_278,"FileOutputStream",&local_3b);
  std::__cxx11::string::string((string *)&local_258,"_init_instance",&local_3a);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_778,fileOutputStream_initInstance,&local_278,&local_258);
  std::__cxx11::string::string((string *)&local_238,"FileOutputStream",&local_39);
  std::__cxx11::string::string((string *)&local_218,"close",&local_38);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_710,fileOutputStream_close,&local_238,&local_218);
  std::__cxx11::string::string((string *)&local_1f8,"FileOutputStream",&local_37);
  std::__cxx11::string::string((string *)&local_1d8,"flush",&local_36);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_6a8,fileOutputStream_flush,&local_1f8,&local_1d8);
  std::__cxx11::string::string((string *)&local_1b8,"FileOutputStream",&local_35);
  std::__cxx11::string::string((string *)&local_198,"_native_write",&local_34);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_640,fileOutputStream_write,&local_1b8,&local_198);
  std::__cxx11::string::string((string *)&local_178,"FileOutputStream",&local_33);
  std::__cxx11::string::string((string *)&local_158,"_native_seek",&local_32);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_5d8,fileOutputStream_seek,&local_178,&local_158);
  std::__cxx11::string::string((string *)&local_138,"FileOutputStream",&local_31);
  std::__cxx11::string::string((string *)&local_118,"position",&local_30);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_570,fileOutputStream_position,&local_138,&local_118);
  std::__cxx11::string::string((string *)&local_f8,"Reader",&local_2f);
  std::__cxx11::string::string((string *)&local_d8,"_convertToString",&local_2e);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (&local_508,reader_convertToString,&local_f8,&local_d8);
  std::__cxx11::string::string((string *)&local_b8,"Writer",&local_2d);
  std::__cxx11::string::string((string *)&local_98,"_convertToUtf8",&local_2c);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_4a0,writer_convertToUtf8,&local_b8,&local_98);
  __l_00._M_len = 0xe;
  __l_00._M_array = local_9e8;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,__l_00,&local_2b);
  lVar2 = 0x548;
  do {
    NativeCallHandlerInfo::~NativeCallHandlerInfo
              ((NativeCallHandlerInfo *)((long)&local_9e8[0].handler + lVar2));
    lVar2 = lVar2 + -0x68;
  } while (lVar2 != -0x68);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&in_RDI->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_78);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&in_RDI->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
  std::make_shared<chatra::emb::io::IoPackageInterface>();
  _Var1._M_p = local_9e8[0].className._M_dataplus._M_p;
  (in_RDI->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_9e8[0].handler;
  local_9e8[0].className._M_dataplus._M_p = (pointer)0x0;
  (in_RDI->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_p;
  local_9e8[0].handler = (NativeCallHandler)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_9e8[0].className);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_78);
  return in_RDI;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"io", script}};
	std::vector<HandlerInfo> handlers = {
			{fileInputStream_initInstance, "FileInputStream", "_init_instance"},
			{fileInputStream_close, "FileInputStream", "close"},
			{fileInputStream_available, "FileInputStream", "available"},
			{fileInputStream_read, "FileInputStream", "_native_read"},
			{fileInputStream_seek, "FileInputStream", "_native_seek"},
			{fileInputStream_position, "FileInputStream", "position"},
			{fileOutputStream_initInstance, "FileOutputStream", "_init_instance"},
			{fileOutputStream_close, "FileOutputStream", "close"},
			{fileOutputStream_flush, "FileOutputStream", "flush"},
			{fileOutputStream_write, "FileOutputStream", "_native_write"},
			{fileOutputStream_seek, "FileOutputStream", "_native_seek"},
			{fileOutputStream_position, "FileOutputStream", "position"},
			{reader_convertToString, "Reader", "_convertToString"},
			{writer_convertToUtf8, "Writer", "_convertToUtf8"},
	};
	return {scripts, handlers, std::make_shared<IoPackageInterface>()};
}